

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals)

{
  undefined4 *puVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  uint32_t *puVar6;
  HasherCommon *pHVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  int iVar14;
  void *__dest;
  long lVar15;
  long lVar16;
  long lVar17;
  StartPosQueue *queue;
  size_t sVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 *puVar23;
  ulong uVar24;
  long lVar25;
  size_t sVar26;
  long lVar27;
  ulong uVar28;
  int *data;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  size_t pos;
  long lVar37;
  size_t length;
  ulong uVar38;
  uint8_t *puVar39;
  bool bVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ZopfliNode *nodes;
  ulong local_27d8;
  ulong local_27d0;
  ulong local_27c8;
  ulong local_27c0;
  ulong local_27b8;
  uint local_27a8;
  void *local_27a0;
  ulong local_2798;
  void *local_2778;
  long local_2750;
  ulong local_2748;
  long local_2740;
  ulong local_2728;
  int orig_dist_cache [4];
  ZopfliCostModel model;
  uint32_t histogram_cmd [704];
  uint32_t histogram_literal [256];
  float local_cb8 [256];
  uint32_t histogram_dist [544];
  
  sVar5 = params->stream_offset;
  iVar14 = params->lgwin;
  if (num_bytes == 0) {
    local_2778 = (void *)0x0;
    local_2748 = 0;
    local_27a0 = (void *)0x0;
    local_2728 = position;
  }
  else {
    local_2748 = num_bytes * 4;
    local_2778 = BrotliAllocate(m,local_2748);
    lVar27 = num_bytes - 0x7f;
    if (num_bytes < 0x7f) {
      lVar27 = 0;
    }
    local_2728 = lVar27 + position;
    if (local_2748 == 0) {
      local_27a0 = (void *)0x0;
      local_2748 = 0;
    }
    else {
      local_27a0 = BrotliAllocate(m,num_bytes << 5);
    }
  }
  uVar22 = (1L << ((byte)iVar14 & 0x3f)) - 0x10;
  lVar17 = 0;
  lVar27 = 0;
  do {
    if (num_bytes <= lVar17 + 3U) {
      sVar5 = *num_literals;
      sVar8 = *last_insert_len;
      uVar11 = *(undefined8 *)dist_cache;
      uVar12 = *(undefined8 *)(dist_cache + 2);
      sVar9 = *num_commands;
      length = num_bytes + 1;
      if (length == 0) {
        queue = (StartPosQueue *)0x0;
      }
      else {
        queue = (StartPosQueue *)BrotliAllocate(m,length * 0x10);
      }
      InitZopfliCostModel(m,&model,&params->dist,num_bytes);
      lVar27 = 0;
      do {
        if (lVar27 == 2) {
          CleanupZopfliCostModel(m,&model);
          BrotliFree(m,queue);
          BrotliFree(m,local_27a0);
          BrotliFree(m,local_2778);
          return;
        }
        BrotliInitZopfliNodes((ZopfliNode *)queue,length);
        if (lVar27 == 0) {
          ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
        }
        else {
          sVar26 = *num_commands;
          memset(histogram_literal,0,0x400);
          memset(histogram_cmd,0,0xb00);
          memset(histogram_dist,0,0x880);
          uVar22 = position - sVar8;
          for (lVar17 = 0; lVar17 != sVar26 - sVar9; lVar17 = lVar17 + 1) {
            uVar19 = commands[lVar17].insert_len_;
            uVar13 = commands[lVar17].copy_len_;
            uVar3 = commands[lVar17].dist_prefix_;
            uVar4 = commands[lVar17].cmd_prefix_;
            histogram_cmd[uVar4] = histogram_cmd[uVar4] + 1;
            if (0x7f < uVar4) {
              histogram_dist[uVar3 & 0x3ff] = histogram_dist[uVar3 & 0x3ff] + 1;
            }
            uVar31 = (ulong)uVar19;
            uVar28 = uVar22;
            while (bVar40 = uVar31 != 0, uVar31 = uVar31 - 1, bVar40) {
              histogram_literal[ringbuffer[uVar28 & ringbuffer_mask]] =
                   histogram_literal[ringbuffer[uVar28 & ringbuffer_mask]] + 1;
              uVar28 = uVar28 + 1;
            }
            uVar22 = uVar22 + uVar19 + (ulong)(uVar13 & 0x1ffffff);
          }
          SetCost(histogram_literal,0x100,1,local_cb8);
          SetCost(histogram_cmd,0x2c0,0,model.cost_cmd_);
          SetCost(histogram_dist,(ulong)model.distance_histogram_size,0,model.cost_dist_);
          model.min_cost_cmd_ = 1.7e+38;
          for (lVar17 = 0; lVar17 != 0x2c0; lVar17 = lVar17 + 1) {
            if (model.cost_cmd_[lVar17] <= model.min_cost_cmd_) {
              model.min_cost_cmd_ = model.cost_cmd_[lVar17];
            }
          }
          *model.literal_costs_ = 0.0;
          fVar42 = 0.0;
          fVar41 = 0.0;
          for (sVar26 = 0; model.num_bytes_ != sVar26; sVar26 = sVar26 + 1) {
            fVar2 = (float)histogram_dist
                           [(ulong)ringbuffer[position + sVar26 & ringbuffer_mask] - 0x100];
            fVar43 = fVar41 + fVar42 + fVar2;
            model.literal_costs_[sVar26 + 1] = fVar43;
            fVar42 = (fVar42 + fVar2) - (fVar43 - fVar41);
            fVar41 = fVar43;
          }
        }
        *num_commands = sVar9;
        *num_literals = sVar5;
        *last_insert_len = sVar8;
        *(undefined8 *)dist_cache = uVar11;
        *(undefined8 *)(dist_cache + 2) = uVar12;
        nodes = (ZopfliNode *)0x1;
        sVar26 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
        uVar19 = 0x145;
        if (params->quality < 0xb) {
          uVar19 = 0x96;
        }
        sVar10 = params->stream_offset;
        *(undefined4 *)&queue->q_[0].pos = 0;
        queue->q_[0].distance_cache[1] = 0;
        histogram_cmd[0x40] = 0;
        histogram_cmd[0x41] = 0;
        lVar17 = 0;
        for (pos = 0; pos + 3 < num_bytes; pos = pos + 1) {
          sVar18 = UpdateNodes(num_bytes,position,pos,ringbuffer,ringbuffer_mask,params,sVar26,
                               dist_cache,(ulong)*(uint *)((long)local_2778 + pos * 4),
                               (BackwardMatch *)((long)local_27a0 + lVar17 * 8),&model,
                               (StartPosQueue *)histogram_cmd,(ZopfliNode *)queue);
          uVar22 = 0;
          if (0x3fff < sVar18) {
            uVar22 = sVar18;
          }
          uVar31 = (ulong)*(uint *)((long)local_2778 + pos * 4);
          lVar17 = lVar17 + uVar31;
          if (((uVar31 == 1) &&
              (uVar13 = *(uint *)((long)local_27a0 + lVar17 * 8 + -4) >> 5, uVar19 < uVar13)) &&
             (uVar22 < uVar13)) {
            uVar22 = (ulong)uVar13;
          }
          if (1 < uVar22) {
            while (uVar22 = uVar22 - 1, uVar22 != 0) {
              if (num_bytes <= pos + 4) {
                pos = pos + 1;
                break;
              }
              pos = pos + 1;
              EvaluateNode(sVar10 + position,pos,sVar26,(size_t)dist_cache,(int *)&model,
                           (ZopfliCostModel *)histogram_cmd,queue,nodes);
              lVar17 = lVar17 + (ulong)*(uint *)((long)local_2778 + pos * 4);
            }
          }
        }
        sVar26 = ComputeShortestPathFromNodes(num_bytes,(ZopfliNode *)queue);
        *num_commands = *num_commands + sVar26;
        BrotliZopfliCreateCommands
                  (num_bytes,position,(ZopfliNode *)queue,dist_cache,last_insert_len,params,commands
                   ,num_literals);
        lVar27 = lVar27 + 1;
      } while( true );
    }
    uVar31 = lVar17 + position;
    uVar28 = uVar22;
    if (uVar31 < uVar22) {
      uVar28 = uVar31;
    }
    uVar20 = uVar31 + sVar5;
    if (uVar22 <= uVar20) {
      uVar20 = uVar22;
    }
    uVar24 = lVar27 + 0x80;
    if (local_2748 < uVar24) {
      uVar29 = local_2748;
      if (local_2748 == 0) {
        uVar29 = uVar24;
      }
      do {
        uVar21 = uVar29;
        uVar29 = uVar21 * 2;
      } while (uVar21 < uVar24);
      __dest = BrotliAllocate(m,uVar21 * 8);
      if (local_2748 != 0) {
        memcpy(__dest,local_27a0,local_2748 << 3);
      }
      BrotliFree(m,local_27a0);
      local_27a0 = __dest;
      local_2748 = uVar21;
    }
    uVar29 = num_bytes - lVar17;
    uVar24 = 0x10;
    if (params->quality == 0xb) {
      uVar24 = 0x40;
    }
    puVar1 = (undefined4 *)((long)local_27a0 + lVar27 * 8);
    uVar21 = 0;
    if (uVar24 <= uVar31) {
      uVar21 = uVar31 - uVar24;
    }
    data = (int *)(ringbuffer + (uVar31 & ringbuffer_mask));
    uVar32 = uVar31;
    puVar23 = puVar1;
    uVar24 = 1;
    while (((uVar32 = uVar32 - 1, uVar21 < uVar32 && (uVar24 < 3)) && (uVar31 - uVar32 <= uVar28)))
    {
      uVar33 = uVar32 & ringbuffer_mask;
      if (((uint8_t)*data == ringbuffer[uVar33]) &&
         (*(uint8_t *)((long)data + 1) == ringbuffer[uVar33 + 1])) {
        uVar35 = 0;
        lVar37 = 0;
LAB_00120081:
        uVar30 = (ulong)((uint)uVar29 & 7);
        uVar34 = uVar29 & 0xfffffffffffffff8;
        if (uVar29 >> 3 == uVar35) {
          for (; (uVar35 = uVar29, uVar30 != 0 &&
                 (uVar35 = uVar34, ringbuffer[uVar34 + uVar33] == *(uint8_t *)((long)data + uVar34))
                 ); uVar34 = uVar34 + 1) {
            uVar30 = uVar30 - 1;
          }
        }
        else {
          if (*(ulong *)(data + uVar35 * 2) == *(ulong *)(ringbuffer + uVar35 * 8 + uVar33))
          goto code_r0x00120093;
          uVar35 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar33) ^ *(ulong *)(data + uVar35 * 2);
          uVar33 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
            }
          }
          uVar35 = (uVar33 >> 3 & 0x1fffffff) - lVar37;
        }
        if (uVar24 < uVar35) {
          *puVar23 = (int)(uVar31 - uVar32);
          puVar23[1] = (int)uVar35 << 5;
          puVar23 = puVar23 + 2;
          uVar24 = uVar35;
        }
      }
    }
    local_27a8 = (uint)ringbuffer_mask;
    if (uVar24 < uVar29) {
      uVar13 = (uint)(*data * 0x1e35a7bd) >> 0xf;
      uVar21 = (hasher->privat)._H5.bucket_size_;
      puVar6 = (hasher->privat)._H2.buckets_;
      pHVar7 = (hasher->privat)._H40.common;
      uVar19 = puVar6[uVar13];
      uVar32 = uVar29;
      if (0x7f < uVar29) {
        puVar6[uVar13] = (uint32_t)uVar31;
        uVar32 = 0x80;
      }
      uVar33 = uVar21 & uVar31;
      local_2740 = uVar33 * 2 + 1;
      local_2750 = uVar33 * 2;
      local_2798 = 0;
      local_27c0 = 0;
      lVar37 = 0x40;
      while (uVar33 = uVar31 - uVar19, uVar33 != 0) {
        bVar40 = lVar37 == 0;
        lVar37 = lVar37 + -1;
        if ((uVar28 < uVar33) || (bVar40)) break;
        uVar35 = local_27c0;
        if (local_2798 < local_27c0) {
          uVar35 = local_2798;
        }
        lVar16 = uVar35 + (uVar19 & local_27a8);
        uVar34 = uVar29 - uVar35;
        uVar30 = uVar34 & 0xfffffffffffffff8;
        uVar36 = 0;
        lVar15 = 0;
LAB_0012021c:
        if (uVar34 >> 3 == uVar36) {
          uVar38 = (ulong)((uint)uVar34 & 7);
          puVar39 = ringbuffer + (lVar16 - lVar15);
          for (; (bVar40 = uVar38 != 0, uVar38 = uVar38 - 1, uVar36 = uVar34, bVar40 &&
                 (uVar36 = uVar30, *(uint8_t *)((long)data + uVar30 + uVar35) == *puVar39));
              uVar30 = uVar30 + 1) {
            puVar39 = puVar39 + 1;
          }
        }
        else {
          uVar38 = *(ulong *)((long)data + uVar36 * 8 + uVar35);
          if (*(ulong *)(ringbuffer + uVar36 * 8 + lVar16) == uVar38) goto code_r0x00120238;
          uVar38 = uVar38 ^ *(ulong *)(ringbuffer + uVar36 * 8 + lVar16);
          uVar30 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          uVar36 = (uVar30 >> 3 & 0x1fffffff) - lVar15;
        }
        uVar36 = uVar36 + uVar35;
        if (puVar23 == (undefined4 *)0x0) {
          puVar23 = (undefined4 *)0x0;
        }
        else if (uVar24 < uVar36) {
          *puVar23 = (int)uVar33;
          puVar23[1] = (int)uVar36 << 5;
          puVar23 = puVar23 + 2;
          uVar24 = uVar36;
        }
        uVar13 = (uint)uVar21;
        if (uVar32 <= uVar36) {
          if (uVar29 < 0x80) goto LAB_001203dc;
          *(undefined4 *)((long)&pHVar7->extra + local_2750 * 4) =
               *(undefined4 *)(&pHVar7->extra + (uVar13 & uVar19));
          iVar14 = *(int *)((long)&pHVar7->extra + (ulong)(uVar13 & uVar19) * 8 + 4);
          goto LAB_001203d1;
        }
        if (ringbuffer[uVar36 + (uVar19 & local_27a8)] < *(byte *)((long)data + uVar36)) {
          if (0x7f < uVar29) {
            *(uint *)((long)&pHVar7->extra + local_2750 * 4) = uVar19;
          }
          lVar16 = (ulong)(uVar19 & uVar13) * 2 + 1;
          local_2798 = uVar36;
          local_2750 = lVar16;
        }
        else {
          if (0x7f < uVar29) {
            *(uint *)((long)&pHVar7->extra + local_2740 * 4) = uVar19;
          }
          lVar16 = (ulong)(uVar19 & uVar13) * 2;
          local_27c0 = uVar36;
          local_2740 = lVar16;
        }
        uVar19 = *(uint *)((long)&pHVar7->extra + lVar16 * 4);
      }
      if (0x7f < uVar29) {
        iVar14 = (hasher->privat)._H5.hash_shift_;
        *(int *)((long)&pHVar7->extra + local_2750 * 4) = iVar14;
LAB_001203d1:
        *(int *)((long)&pHVar7->extra + local_2740 * 4) = iVar14;
      }
    }
LAB_001203dc:
    for (lVar37 = 0; lVar37 != 0x26; lVar37 = lVar37 + 1) {
      histogram_cmd[lVar37] = 0xfffffff;
    }
    uVar28 = uVar24 + 1;
    if (uVar24 + 1 < 5) {
      uVar28 = 4;
    }
    iVar14 = BrotliFindAllStaticDictionaryMatches
                       (&params->dictionary,(uint8_t *)data,uVar28,uVar29,histogram_cmd);
    if (iVar14 != 0) {
      if (0x24 < uVar29) {
        uVar29 = 0x25;
      }
      iVar14 = (int)uVar28 << 5;
      for (; uVar28 <= uVar29; uVar28 = uVar28 + 1) {
        uVar19 = histogram_cmd[uVar28];
        if ((uVar19 < 0xfffffff) &&
           (uVar24 = (ulong)(uVar19 >> 5) + uVar20 + 1, uVar24 <= (params->dist).max_distance)) {
          uVar19 = uVar19 & 0x1f;
          *puVar23 = (int)uVar24;
          if (uVar28 == uVar19) {
            uVar19 = 0;
          }
          puVar23[1] = uVar19 + iVar14;
          puVar23 = puVar23 + 2;
        }
        iVar14 = iVar14 + 0x20;
      }
    }
    lVar16 = (long)puVar23 - (long)puVar1 >> 3;
    *(int *)((long)local_2778 + lVar17 * 4) = (int)lVar16;
    lVar37 = lVar27;
    if (puVar23 != puVar1) {
      lVar37 = lVar16 + lVar27;
      uVar19 = *(uint *)((long)local_27a0 + lVar37 * 8 + -4);
      if (0x28bf < uVar19) {
        uVar24 = (ulong)(uVar19 >> 5);
        *(undefined8 *)((long)local_27a0 + lVar27 * 8) =
             *(undefined8 *)((long)local_27a0 + lVar37 * 8 + -8);
        uVar28 = uVar31 + 1;
        uVar20 = uVar31 + uVar24;
        lVar37 = uVar24 - 1;
        if (local_2728 <= uVar20) {
          uVar20 = local_2728;
        }
        uVar24 = uVar20 - 0x3f;
        if (uVar20 < uVar31 + 0x40) {
          uVar24 = uVar28;
        }
        *(undefined4 *)((long)local_2778 + lVar17 * 4) = 1;
        if (uVar31 + 0x201 <= uVar24) {
          for (; uVar28 < uVar24; uVar28 = uVar28 + 8) {
            uVar31 = (hasher->privat)._H5.bucket_size_;
            puVar6 = (hasher->privat)._H2.buckets_;
            uVar21 = uVar28 & ringbuffer_mask;
            pHVar7 = (hasher->privat)._H40.common;
            uVar13 = (uint)(*(int *)(ringbuffer + uVar21) * 0x1e35a7bd) >> 0xf;
            uVar19 = puVar6[uVar13];
            local_27d8 = (uVar31 & uVar28) * 2 + 1;
            local_27b8 = (uVar31 & uVar28) * 2;
            puVar6[uVar13] = (uint32_t)uVar28;
            local_27c8 = 0;
            uVar29 = 0;
            lVar16 = 0x40;
            while (uVar28 != uVar19) {
              bVar40 = lVar16 == 0;
              lVar16 = lVar16 + -1;
              if ((uVar31 - 0xf < uVar28 - uVar19) || (bVar40)) break;
              uVar32 = uVar29;
              if (local_27c8 < uVar29) {
                uVar32 = local_27c8;
              }
              lVar15 = uVar32 + (uVar19 & local_27a8);
              uVar30 = 0x80 - uVar32;
              uVar33 = uVar30 & 0xfffffffffffffff8;
              uVar35 = 0;
              lVar25 = 0;
LAB_00120640:
              if (uVar30 >> 3 == uVar35) {
                uVar34 = (ulong)((uint)uVar30 & 7);
                puVar39 = ringbuffer + (lVar15 - lVar25);
                for (; (bVar40 = uVar34 != 0, uVar34 = uVar34 - 1, uVar35 = uVar30, bVar40 &&
                       (uVar35 = uVar33, ringbuffer[uVar33 + uVar32 + uVar21] == *puVar39));
                    uVar33 = uVar33 + 1) {
                  puVar39 = puVar39 + 1;
                }
              }
              else {
                if (*(ulong *)(ringbuffer + uVar35 * 8 + lVar15) ==
                    *(ulong *)(ringbuffer + uVar35 * 8 + uVar32 + uVar21)) goto code_r0x0012065f;
                uVar35 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar32 + uVar21) ^
                         *(ulong *)(ringbuffer + uVar35 * 8 + lVar15);
                uVar33 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                uVar35 = (uVar33 >> 3 & 0x1fffffff) - lVar25;
              }
              uVar35 = uVar35 + uVar32;
              local_27c0._0_4_ = (uint)uVar31;
              if (0x7f < uVar35) {
                *(undefined4 *)((long)&pHVar7->extra + local_27b8 * 4) =
                     *(undefined4 *)(&pHVar7->extra + ((uint)local_27c0 & uVar19));
                iVar14 = *(int *)((long)&pHVar7->extra + (ulong)((uint)local_27c0 & uVar19) * 8 + 4)
                ;
                goto LAB_00120753;
              }
              uVar32 = (ulong)(uVar19 & (uint)local_27c0) * 2;
              if (ringbuffer[uVar35 + (uVar19 & local_27a8)] < ringbuffer[uVar35 + uVar21]) {
                *(uint *)((long)&pHVar7->extra + local_27b8 * 4) = uVar19;
                uVar32 = uVar32 | 1;
                local_27c8 = uVar35;
                local_27b8 = uVar32;
              }
              else {
                *(uint *)((long)&pHVar7->extra + local_27d8 * 4) = uVar19;
                uVar29 = uVar35;
                local_27d8 = uVar32;
              }
              uVar19 = *(uint *)((long)&pHVar7->extra + uVar32 * 4);
            }
            iVar14 = (hasher->privat)._H5.hash_shift_;
            *(int *)((long)&pHVar7->extra + local_27b8 * 4) = iVar14;
LAB_00120753:
            *(int *)((long)&pHVar7->extra + local_27d8 * 4) = iVar14;
          }
        }
        for (; uVar24 < uVar20; uVar24 = uVar24 + 1) {
          uVar31 = (hasher->privat)._H5.bucket_size_;
          puVar6 = (hasher->privat)._H2.buckets_;
          uVar21 = uVar24 & ringbuffer_mask;
          pHVar7 = (hasher->privat)._H40.common;
          uVar13 = (uint)(*(int *)(ringbuffer + uVar21) * 0x1e35a7bd) >> 0xf;
          uVar19 = puVar6[uVar13];
          local_27d0 = (uVar31 & uVar24) * 2 + 1;
          local_27d8 = (uVar31 & uVar24) * 2;
          puVar6[uVar13] = (uint32_t)uVar24;
          uVar29 = 0;
          uVar28 = 0;
          lVar16 = 0x40;
          while (uVar24 != uVar19) {
            bVar40 = lVar16 == 0;
            lVar16 = lVar16 + -1;
            if ((uVar31 - 0xf < uVar24 - uVar19) || (bVar40)) break;
            uVar32 = uVar28;
            if (uVar29 < uVar28) {
              uVar32 = uVar29;
            }
            lVar15 = uVar32 + (uVar19 & local_27a8);
            uVar33 = 0x80 - uVar32;
            uVar35 = uVar33 & 0xfffffffffffffff8;
            uVar30 = 0;
            lVar25 = 0;
LAB_00120841:
            if (uVar33 >> 3 == uVar30) {
              uVar34 = (ulong)((uint)uVar33 & 7);
              puVar39 = ringbuffer + (lVar15 - lVar25);
              for (; (bVar40 = uVar34 != 0, uVar34 = uVar34 - 1, uVar30 = uVar33, bVar40 &&
                     (uVar30 = uVar35, ringbuffer[uVar35 + uVar32 + uVar21] == *puVar39));
                  uVar35 = uVar35 + 1) {
                puVar39 = puVar39 + 1;
              }
            }
            else {
              if (*(ulong *)(ringbuffer + uVar30 * 8 + lVar15) ==
                  *(ulong *)(ringbuffer + uVar30 * 8 + uVar32 + uVar21)) goto code_r0x0012085a;
              uVar35 = *(ulong *)(ringbuffer + uVar30 * 8 + uVar32 + uVar21) ^
                       *(ulong *)(ringbuffer + uVar30 * 8 + lVar15);
              uVar33 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar30 = (uVar33 >> 3 & 0x1fffffff) - lVar25;
            }
            uVar30 = uVar30 + uVar32;
            local_27c0._0_4_ = (uint)uVar31;
            if (0x7f < uVar30) {
              *(undefined4 *)((long)&pHVar7->extra + local_27d8 * 4) =
                   *(undefined4 *)(&pHVar7->extra + ((uint)local_27c0 & uVar19));
              iVar14 = *(int *)((long)&pHVar7->extra + (ulong)((uint)local_27c0 & uVar19) * 8 + 4);
              goto LAB_0012094f;
            }
            uVar32 = (ulong)(uVar19 & (uint)local_27c0) * 2;
            if (ringbuffer[uVar30 + (uVar19 & local_27a8)] < ringbuffer[uVar30 + uVar21]) {
              *(uint *)((long)&pHVar7->extra + local_27d8 * 4) = uVar19;
              uVar32 = uVar32 | 1;
              uVar29 = uVar30;
              local_27d8 = uVar32;
            }
            else {
              *(uint *)((long)&pHVar7->extra + local_27d0 * 4) = uVar19;
              uVar28 = uVar30;
              local_27d0 = uVar32;
            }
            uVar19 = *(uint *)((long)&pHVar7->extra + uVar32 * 4);
          }
          iVar14 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)&pHVar7->extra + local_27d8 * 4) = iVar14;
LAB_0012094f:
          *(int *)((long)&pHVar7->extra + local_27d0 * 4) = iVar14;
        }
        memset((void *)((long)local_2778 + lVar17 * 4 + 4),0,lVar37 * 4);
        lVar17 = lVar17 + lVar37;
        lVar37 = lVar27 + 1;
      }
    }
    lVar17 = lVar17 + 1;
    lVar27 = lVar37;
  } while( true );
code_r0x00120093:
  lVar37 = lVar37 + -8;
  uVar35 = uVar35 + 1;
  goto LAB_00120081;
code_r0x00120238:
  lVar15 = lVar15 + -8;
  uVar36 = uVar36 + 1;
  goto LAB_0012021c;
code_r0x0012065f:
  lVar25 = lVar25 + -8;
  uVar35 = uVar35 + 1;
  goto LAB_00120640;
code_r0x0012085a:
  lVar25 = lVar25 + -8;
  uVar30 = uVar30 + 1;
  goto LAB_00120841;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  size_t gap = 0;
  size_t shadow_matches = 0;
  BROTLI_UNUSED(literal_context_lut);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(num_matches) ||
      BROTLI_IS_NULL(matches)) {
    return;
  }
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(&hasher->privat._H10,
        &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, dictionary_start + gap, params,
        &matches[cur_match_pos + shadow_matches]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(&hasher->privat._H10,
                      ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, gap, dist_cache, &model, num_matches, matches,
        nodes);
    BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
        last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}